

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc_pars.h
# Opt level: O2

zkbpp_lowmc_implementation_f get_zkbpp_lowmc_implementation(lowmc_parameters_t *lowmc)

{
  uint uVar1;
  
  uVar1 = (uint)lowmc->m | (uint)lowmc->n << 0x10;
  if ((~DAT_001bf10c & 0x20400) != 0) {
    if (uVar1 == 0x80000a) {
      return mpc_lowmc_prove_s128_lowmc_128_128_20;
    }
    if (uVar1 == 0x81002b) {
      return mpc_lowmc_prove_s128_lowmc_129_129_4;
    }
    if (uVar1 == 0x100000a) {
      return mpc_lowmc_prove_s128_lowmc_256_256_38;
    }
    if (uVar1 != 0xc00040) {
      if (uVar1 == 0xff0055) {
        return mpc_lowmc_prove_s128_lowmc_255_255_4;
      }
      return mpc_lowmc_prove_s128_lowmc_192_192_30;
    }
    return mpc_lowmc_prove_s128_lowmc_192_192_4;
  }
  if (uVar1 == 0x80000a) {
    return mpc_lowmc_prove_s256_lowmc_128_128_20;
  }
  if (uVar1 == 0x81002b) {
    return mpc_lowmc_prove_s256_lowmc_129_129_4;
  }
  if (uVar1 == 0x100000a) {
    return mpc_lowmc_prove_s256_lowmc_256_256_38;
  }
  if (uVar1 != 0xc00040) {
    if (uVar1 == 0xff0055) {
      return mpc_lowmc_prove_s256_lowmc_255_255_4;
    }
    return mpc_lowmc_prove_s256_lowmc_192_192_30;
  }
  return mpc_lowmc_prove_s256_lowmc_192_192_4;
}

Assistant:

static inline ATTR_PURE uint32_t lowmc_get_id(const lowmc_parameters_t* lowmc) {
  return LOWMC_ID(lowmc->n, lowmc->m);
}